

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::alloc
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this,int new_len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  CJoystick *pCVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  CJoystick *pCVar8;
  undefined4 uVar9;
  undefined4 uVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar10 [16];
  
  this->list_size = new_len;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)new_len;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x98),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0x98),0);
  }
  pCVar4 = (CJoystick *)operator_new__(uVar5);
  auVar2 = _DAT_001d6f30;
  auVar1 = _DAT_001d6390;
  if (new_len != 0) {
    uVar5 = (long)new_len * 0x98 - 0x98;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar5;
    uVar9 = SUB164(auVar14 * ZEXT816(0xd79435e50d79435f),8);
    uVar12 = (undefined4)(uVar5 / 0x130000000);
    auVar10._0_8_ = CONCAT44(uVar12,uVar9);
    auVar10._8_4_ = uVar9;
    auVar10._12_4_ = uVar12;
    auVar11._0_8_ = auVar10._0_8_ >> 7;
    auVar11._8_8_ = auVar10._8_8_ >> 7;
    uVar6 = 0;
    auVar11 = auVar11 ^ _DAT_001d6390;
    pCVar8 = pCVar4;
    do {
      auVar13._8_4_ = (int)uVar6;
      auVar13._0_8_ = uVar6;
      auVar13._12_4_ = (int)(uVar6 >> 0x20);
      auVar14 = (auVar13 | auVar2) ^ auVar1;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        (pCVar8->super_IJoystick)._vptr_IJoystick = (_func_int **)&PTR_GetIndex_002134a0;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        pCVar8[1].super_IJoystick._vptr_IJoystick = (_func_int **)&PTR_GetIndex_002134a0;
      }
      uVar6 = uVar6 + 2;
      pCVar8 = pCVar8 + 2;
    } while ((uVar5 / 0x98 + 2 & 0xfffffffffffffffe) != uVar6);
  }
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar8 = this->list;
    lVar7 = 0;
    do {
      memcpy(pCVar4->m_aName + lVar7 + -0xc,pCVar8->m_aName + lVar7 + -0xc,0x90);
      lVar7 = lVar7 + 0x98;
    } while ((ulong)(uint)new_len * 0x98 - lVar7 != 0);
  }
  if (this->list != (CJoystick *)0x0) {
    operator_delete__(this->list);
  }
  iVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar3 = this->num_elements;
  }
  this->num_elements = iVar3;
  this->list = pCVar4;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}